

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::setValue(CommonCore *this,InterfaceHandle handle,char *data,uint64_t len)

{
  GlobalHandle hand;
  string_view message;
  string_view message_00;
  bool bVar1;
  int iVar2;
  GlobalFederateId GVar3;
  int32_t iVar4;
  undefined8 uVar5;
  size_type sVar6;
  reference pvVar7;
  reference pGVar8;
  BaseType in_ESI;
  undefined8 in_RDI;
  int res;
  GlobalHandle *target;
  iterator __end2;
  iterator __begin2;
  vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *__range2;
  ActionMessage pub;
  ActionMessage package;
  ActionMessage pub_1;
  vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> subs;
  FederateState *fed;
  _Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  *handleInfo;
  undefined4 in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffacc;
  undefined4 in_stack_fffffffffffffad0;
  InterfaceHandle in_stack_fffffffffffffad4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad8;
  GlobalFederateId in_stack_fffffffffffffae0;
  int in_stack_fffffffffffffae4;
  undefined4 in_stack_fffffffffffffae8;
  action_t in_stack_fffffffffffffaec;
  action_t startingAction;
  undefined4 in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf4;
  undefined4 in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb0c;
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
  *in_stack_fffffffffffffb10;
  FederateState *in_stack_fffffffffffffb18;
  undefined8 in_stack_fffffffffffffb20;
  InterfaceHandle pub_id;
  FederateState *in_stack_fffffffffffffb30;
  InterfaceHandle handle_00;
  __normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
  local_3e0;
  vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *local_3d8;
  baseType local_3d0;
  BaseType local_3c4;
  GlobalFederateId local_3b8;
  InterfaceHandle local_3b4;
  uint16_t local_3a8;
  Time local_3a0;
  undefined1 in_stack_fffffffffffffc73;
  int in_stack_fffffffffffffc74;
  Time in_stack_fffffffffffffc78;
  string_view in_stack_fffffffffffffc80;
  string_view in_stack_fffffffffffffc90;
  format_args in_stack_fffffffffffffd30;
  string_view in_stack_fffffffffffffd40;
  ActionMessage local_230;
  undefined4 local_178;
  BaseType local_174;
  vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> local_170;
  char *local_148;
  undefined8 local_140;
  undefined1 local_138 [48];
  __sv_type local_108;
  atomic<helics::GlobalFederateId> local_f8;
  undefined4 local_f4;
  FederateState *local_f0;
  BasicHandleInfo *local_c0;
  size_type local_b8 [3];
  GlobalFederateId local_9c;
  undefined1 local_98 [32];
  __node_base_ptr local_78;
  undefined1 local_70 [40];
  char *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  pointer local_30;
  pointer local_28;
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *local_20;
  __node_base_ptr *local_18;
  pointer local_10;
  __node_base local_8;
  
  pub_id.hid = (BaseType)((ulong)in_stack_fffffffffffffb20 >> 0x20);
  handle_00.hid = (BaseType)((ulong)in_RDI >> 0x20);
  local_9c.gid = in_ESI;
  local_c0 = (BasicHandleInfo *)
             getHandleInfo((CommonCore *)
                           CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                           in_stack_fffffffffffffad4);
  if (local_c0 == (BasicHandleInfo *)0x0) {
    uVar5 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0.gid),
               (char *)in_stack_fffffffffffffad8);
    message._M_len._4_4_ = in_stack_fffffffffffffaec;
    message._M_len._0_4_ = in_stack_fffffffffffffae8;
    message._M_str._0_4_ = in_stack_fffffffffffffaf0;
    message._M_str._4_4_ = in_stack_fffffffffffffaf4;
    InvalidIdentifier::InvalidIdentifier
              ((InvalidIdentifier *)
               CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0.gid),message);
    __cxa_throw(uVar5,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
  }
  if (local_c0->handleType == PUBLICATION) {
    bVar1 = checkActionFlag<helics::BasicHandleInfo,helics::ConnectionFlags>
                      ((_Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                        *)local_c0,disconnected_flag);
    if ((!bVar1) && ((local_c0->used & 1U) != 0)) {
      local_f4 = *(undefined4 *)
                  &(((_Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                      *)&local_c0->local_fed_id)->
                   super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                   )._M_storage._M_storage;
      local_f0 = getFederateAt((CommonCore *)
                               CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
                               (LocalFederateId)(BaseType)((ulong)in_stack_fffffffffffffb10 >> 0x20)
                              );
      local_f8._M_i.gid = (GlobalFederateId)(GlobalFederateId)local_9c.gid;
      bVar1 = FederateState::checkAndSetValue
                        (in_stack_fffffffffffffb18,pub_id,(char *)in_stack_fffffffffffffb10,
                         CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
      if (bVar1) {
        iVar2 = FederateState::loggingLevel((FederateState *)0x46a77b);
        if (0x11 < iVar2) {
          FederateState::getIdentifier_abi_cxx11_(local_f0);
          local_108 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffffad4.hid,in_stack_fffffffffffffad0
                                            ));
          local_148 = "setting value for {} size {}";
          local_140 = 0x1c;
          local_70._32_8_ = &local_c0->key;
          in_stack_fffffffffffffb18 = (FederateState *)local_138;
          local_48 = "setting value for {} size {}";
          uStack_40 = 0x1c;
          local_70._24_8_ = local_b8;
          local_70._8_8_ = "setting value for {} size {}";
          local_70._16_8_ = 0x1c;
          in_stack_fffffffffffffb10 =
               (BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *)
               local_98;
          local_38 = in_stack_fffffffffffffb18;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)
                     CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0.gid),
                     in_stack_fffffffffffffad8);
          local_28 = (pointer)(local_98 + 0x10);
          local_30 = *(pointer *)local_70._24_8_;
          local_18 = &local_78;
          local_78 = (__node_base_ptr)0x4d;
          local_20 = in_stack_fffffffffffffb10;
          local_10 = local_30;
          local_8._M_nxt = (_Hash_node_base *)local_28;
          local_98._16_8_ = local_30;
          local_70._0_8_ = in_stack_fffffffffffffb10;
          ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffd40,in_stack_fffffffffffffd30);
          local_138._32_16_ =
               (undefined1  [16])
               std::__cxx11::string::operator_cast_to_basic_string_view
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffad4.hid,in_stack_fffffffffffffad0));
          in_stack_fffffffffffffac8 = 0;
          FederateState::logMessage
                    ((FederateState *)in_stack_fffffffffffffc78.internalTimeCode,
                     in_stack_fffffffffffffc74,in_stack_fffffffffffffc90,in_stack_fffffffffffffc80,
                     (bool)in_stack_fffffffffffffc73);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffad4.hid,in_stack_fffffffffffffad0));
        }
        local_174 = local_9c.gid;
        FederateState::getSubscribers(in_stack_fffffffffffffb30,handle_00);
        bVar1 = std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::empty
                          ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                           CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0.gid));
        if (bVar1) {
          local_178 = 1;
        }
        else {
          sVar6 = std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::size
                            (&local_170);
          if (sVar6 == 1) {
            ActionMessage::ActionMessage
                      ((ActionMessage *)
                       CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                       in_stack_fffffffffffffaec);
            GVar3 = BasicHandleInfo::getFederateId(local_c0);
            local_230.source_handle.hid = local_9c.gid;
            local_230.source_id = GVar3;
            pvVar7 = std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::
                     operator[](&local_170,0);
            hand.fed_id.gid = (pvVar7->fed_id).gid;
            hand.handle.hid = (pvVar7->handle).hid;
            ActionMessage::setDestination(&local_230,hand);
            iVar4 = FederateState::getCurrentIteration((FederateState *)0x46aa7f);
            local_230.counter = (uint16_t)iVar4;
            SmallBuffer::assign((SmallBuffer *)
                                CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0.gid),
                                in_stack_fffffffffffffad8,
                                CONCAT44(in_stack_fffffffffffffad4.hid,in_stack_fffffffffffffad0));
            local_230.actionTime = FederateState::nextAllowedSendTime(local_f0);
            gmlc::containers::
            BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
            push<helics::ActionMessage>
                      (in_stack_fffffffffffffb10,(ActionMessage *)CONCAT44(GVar3.gid,iVar4));
            local_178 = 1;
            ActionMessage::~ActionMessage
                      ((ActionMessage *)
                       CONCAT44(in_stack_fffffffffffffad4.hid,in_stack_fffffffffffffad0));
          }
          else {
            ActionMessage::ActionMessage
                      ((ActionMessage *)
                       CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                       in_stack_fffffffffffffaec);
            BasicHandleInfo::getFederateId(local_c0);
            ActionMessage::ActionMessage
                      ((ActionMessage *)
                       CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                       in_stack_fffffffffffffaec);
            local_3c4 = (BaseType)BasicHandleInfo::getFederateId(local_c0);
            local_3b4.hid = local_9c.gid;
            local_3b8 = (GlobalFederateId)local_3c4;
            iVar4 = FederateState::getCurrentIteration((FederateState *)0x46ac01);
            local_3a8 = (uint16_t)iVar4;
            SmallBuffer::assign((SmallBuffer *)
                                CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0.gid),
                                in_stack_fffffffffffffad8,
                                CONCAT44(in_stack_fffffffffffffad4.hid,in_stack_fffffffffffffad0));
            local_3d0 = (baseType)FederateState::nextAllowedSendTime(local_f0);
            startingAction = (action_t)((ulong)local_3d0 >> 0x20);
            local_3d8 = &local_170;
            local_3a0 = (Time)local_3d0;
            local_3e0._M_current =
                 (GlobalHandle *)
                 std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::begin
                           ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                            CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
            std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::end
                      ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                       CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
            while (bVar1 = __gnu_cxx::
                           operator==<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                                     ((__normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                                       *)CONCAT44(in_stack_fffffffffffffad4.hid,
                                                  in_stack_fffffffffffffad0),
                                      (__normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                                       *)CONCAT44(in_stack_fffffffffffffacc,
                                                  in_stack_fffffffffffffac8)),
                  ((bVar1 ^ 0xffU) & 1) != 0) {
              pGVar8 = __gnu_cxx::
                       __normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                       ::operator*(&local_3e0);
              ActionMessage::setDestination((ActionMessage *)&stack0xfffffffffffffc40,*pGVar8);
              in_stack_fffffffffffffae4 =
                   appendMessage((ActionMessage *)in_stack_fffffffffffffb18,
                                 (ActionMessage *)in_stack_fffffffffffffb10);
              if (in_stack_fffffffffffffae4 < 0) {
                gmlc::containers::
                BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
                push<helics::ActionMessage>
                          (in_stack_fffffffffffffb10,
                           (ActionMessage *)
                           CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
                ActionMessage::ActionMessage
                          ((ActionMessage *)CONCAT44(iVar4,in_stack_fffffffffffffaf0),startingAction
                          );
                ActionMessage::operator=
                          ((ActionMessage *)
                           CONCAT44(in_stack_fffffffffffffad4.hid,in_stack_fffffffffffffad0),
                           (ActionMessage *)
                           CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
                ActionMessage::~ActionMessage
                          ((ActionMessage *)
                           CONCAT44(in_stack_fffffffffffffad4.hid,in_stack_fffffffffffffad0));
                in_stack_fffffffffffffae0 = BasicHandleInfo::getFederateId(local_c0);
                appendMessage((ActionMessage *)in_stack_fffffffffffffb18,
                              (ActionMessage *)in_stack_fffffffffffffb10);
              }
              __gnu_cxx::
              __normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
              ::operator++(&local_3e0);
            }
            gmlc::containers::
            BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
            push<helics::ActionMessage>
                      (in_stack_fffffffffffffb10,
                       (ActionMessage *)
                       CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
            ActionMessage::~ActionMessage
                      ((ActionMessage *)
                       CONCAT44(in_stack_fffffffffffffad4.hid,in_stack_fffffffffffffad0));
            ActionMessage::~ActionMessage
                      ((ActionMessage *)
                       CONCAT44(in_stack_fffffffffffffad4.hid,in_stack_fffffffffffffad0));
            local_178 = 0;
          }
        }
        std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::~vector
                  ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                   CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0.gid));
      }
    }
    return;
  }
  uVar5 = __cxa_allocate_exception(0x28);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0.gid),
             (char *)in_stack_fffffffffffffad8);
  message_00._M_len._4_4_ = in_stack_fffffffffffffaec;
  message_00._M_len._0_4_ = in_stack_fffffffffffffae8;
  message_00._M_str._0_4_ = in_stack_fffffffffffffaf0;
  message_00._M_str._4_4_ = in_stack_fffffffffffffaf4;
  InvalidIdentifier::InvalidIdentifier
            ((InvalidIdentifier *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0.gid),
             message_00);
  __cxa_throw(uVar5,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
}

Assistant:

void CommonCore::setValue(InterfaceHandle handle, const char* data, uint64_t len)
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo == nullptr) {
        throw(InvalidIdentifier("Handle not valid (setValue)"));
    }
    if (handleInfo->handleType != InterfaceType::PUBLICATION) {
        throw(InvalidIdentifier("handle does not point to a publication"));
    }
    if (checkActionFlag(*handleInfo, disconnected_flag)) {
        return;
    }
    if (!handleInfo->used) {
        return;  // if the value is not required do nothing
    }
    auto* fed = getFederateAt(handleInfo->local_fed_id);
    if (fed->checkAndSetValue(handle, data, len)) {
        if (fed->loggingLevel() >= HELICS_LOG_LEVEL_DATA) {
            fed->logMessage(HELICS_LOG_LEVEL_DATA,
                            fed->getIdentifier(),
                            fmt::format("setting value for {} size {}", handleInfo->key, len));
        }
        auto subs = fed->getSubscribers(handle);
        if (subs.empty()) {
            return;
        }
        if (subs.size() == 1) {
            ActionMessage pub(CMD_PUB);
            pub.source_id = handleInfo->getFederateId();
            pub.source_handle = handle;
            pub.setDestination(subs[0]);
            pub.counter = static_cast<uint16_t>(fed->getCurrentIteration());
            pub.payload.assign(data, len);
            pub.actionTime = fed->nextAllowedSendTime();
            actionQueue.push(std::move(pub));
            return;
        }
        ActionMessage package(CMD_MULTI_MESSAGE);
        package.source_id = handleInfo->getFederateId();
        package.source_handle = handle;

        ActionMessage pub(CMD_PUB);
        pub.source_id = handleInfo->getFederateId();
        pub.source_handle = handle;
        pub.counter = static_cast<uint16_t>(fed->getCurrentIteration());
        pub.payload.assign(data, len);
        pub.actionTime = fed->nextAllowedSendTime();

        for (auto& target : subs) {
            pub.setDestination(target);
            auto res = appendMessage(package, pub);
            if (res < 0)  // deal with max package size if there are a lot of subscribers
            {
                actionQueue.push(std::move(package));
                package = ActionMessage(CMD_MULTI_MESSAGE);
                package.source_id = handleInfo->getFederateId();
                package.source_handle = handle;
                appendMessage(package, pub);
            }
        }
        actionQueue.push(std::move(package));
    }
}